

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cc
# Opt level: O1

void __thiscall rcg::GenTLException::~GenTLException(GenTLException *this)

{
  ~GenTLException(this);
  operator_delete(this);
  return;
}

Assistant:

GenTLException::~GenTLException()
{ }